

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_ver_6tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  ulong uVar1;
  __m256i alVar2;
  __m256i alVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  int16_t *src;
  long lVar13;
  long lVar14;
  int16_t *piVar15;
  __m256i *palVar16;
  undefined1 (*pauVar17) [32];
  int iVar18;
  uint8_t *dst_00;
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  __m256i alVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  __m256i alVar42;
  undefined1 auVar43 [32];
  __m256i coeffs_256 [3];
  __m256i ss_256 [6];
  __m256i r [2];
  __m256i tt_256 [6];
  __m256i r_2 [4];
  __m256i r1 [4];
  __m256i local_640;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  __m256i local_5e0;
  __m256i local_5c0;
  __m256i local_5a0;
  __m256i local_580;
  __m256i local_560;
  undefined1 local_540 [32];
  __m256i local_520;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  __m256i local_460;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  __m256i local_3a0;
  undefined1 local_380 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  __m256i local_2e0;
  undefined1 local_2c0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  __m256i local_220;
  undefined1 local_200 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  longlong local_160 [8];
  longlong local_120 [8];
  longlong local_e0 [8];
  longlong local_a0 [14];
  
  if (w == 2) {
    auVar19 = *(undefined1 (*) [16])
               (filter_params_y->filter_ptr + (uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
    auVar25 = vpshuflw_avx(auVar19,0xe9);
    auVar22 = vpshufb_avx(auVar19,_DAT_00470aa0);
    auVar21._0_4_ = auVar25._0_4_;
    auVar21._4_4_ = auVar21._0_4_;
    auVar21._8_4_ = auVar21._0_4_;
    auVar21._12_4_ = auVar21._0_4_;
    auVar19 = vpshufhw_avx(auVar19,0xe9);
    auVar25 = vpshufd_avx(auVar19,0xaa);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)im_block;
    auVar19 = vpshufd_avx(auVar31,0x55);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *(ulong *)(im_block + 4);
    auVar36 = vpshufd_avx(auVar38,0x55);
    uVar4 = *(uint *)(im_block + 8);
    auVar32 = vpunpckldq_avx(auVar19,auVar38);
    auVar19 = vpinsrd_avx(auVar36,*(undefined4 *)(im_block + 8),1);
    auVar36 = vpunpcklwd_avx(auVar31,auVar32);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *(ulong *)(im_block + 4);
    auVar19 = vpunpcklwd_avx(auVar39,auVar19);
    lVar14 = 0;
    auVar34._8_4_ = 0x400;
    auVar34._0_8_ = 0x40000000400;
    auVar34._12_4_ = 0x400;
    do {
      auVar23 = auVar19;
      auVar36 = vpmaddwd_avx(auVar36,auVar21);
      auVar19 = vpinsrd_avx(ZEXT416(uVar4),*(undefined4 *)(im_block + lVar14 * 2 + 10),1);
      auVar32 = vpmaddwd_avx(auVar23,auVar22);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *(ulong *)(im_block + lVar14 * 2 + 10);
      auVar19 = vpunpcklwd_avx(auVar19,auVar40);
      uVar4 = *(uint *)(im_block + lVar14 * 2 + 0xc);
      auVar36 = vpaddd_avx(auVar32,auVar36);
      auVar36 = vpaddd_avx(auVar36,auVar34);
      auVar32 = vpmaddwd_avx(auVar19,auVar25);
      auVar36 = vpaddd_avx(auVar32,auVar36);
      auVar36 = vpsrad_avx(auVar36,0xb);
      auVar36 = vpackssdw_avx(auVar36,auVar36);
      auVar36 = vpackuswb_avx(auVar36,auVar36);
      vpextrw_avx(auVar36,0);
      vpextrw_avx(auVar36,1);
      lVar14 = lVar14 + 2;
      auVar36 = auVar23;
    } while (h != (int)lVar14);
  }
  else {
    auVar19 = *(undefined1 (*) [16])
               (filter_params_y->filter_ptr + (uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
    auVar22 = vpsrlq_avx(auVar19,0x10);
    uVar20 = auVar22._0_4_;
    alVar42[0]._4_4_ = uVar20;
    alVar42[0]._0_4_ = uVar20;
    alVar42[1]._0_4_ = uVar20;
    alVar42[1]._4_4_ = uVar20;
    alVar42[2]._0_4_ = uVar20;
    alVar42[2]._4_4_ = uVar20;
    alVar42[3]._0_4_ = uVar20;
    alVar42[3]._4_4_ = uVar20;
    auVar22 = vpsrldq_avx(auVar19,6);
    uVar20 = auVar22._0_4_;
    auVar43._4_4_ = uVar20;
    auVar43._0_4_ = uVar20;
    auVar43._8_4_ = uVar20;
    auVar43._12_4_ = uVar20;
    auVar43._16_4_ = uVar20;
    auVar43._20_4_ = uVar20;
    auVar43._24_4_ = uVar20;
    auVar43._28_4_ = uVar20;
    auVar19 = vpsrldq_avx(auVar19,10);
    local_600._0_4_ = auVar19._0_4_;
    local_600._4_4_ = local_600._0_4_;
    local_600._8_4_ = local_600._0_4_;
    local_600._12_4_ = local_600._0_4_;
    local_600._16_4_ = local_600._0_4_;
    local_600._20_4_ = local_600._0_4_;
    local_600._24_4_ = local_600._0_4_;
    local_600._28_4_ = local_600._0_4_;
    local_640 = alVar42;
    local_620 = auVar43;
    if (w == 0x10) {
      local_5e0 = *(__m256i *)im_block;
      local_5c0 = *(__m256i *)(im_block + 0x10);
      local_5a0 = *(__m256i *)(im_block + 0x20);
      local_580 = *(__m256i *)(im_block + 0x30);
      local_560 = *(__m256i *)(im_block + 0x40);
      if (subpel_y_q4 == 8) {
        palVar16 = (__m256i *)(im_block + 0x60);
        alVar12 = local_5a0;
        alVar8 = local_5c0;
        alVar9 = local_5e0;
        alVar10 = local_580;
        alVar11 = local_560;
        do {
          alVar28 = alVar12;
          alVar2 = palVar16[-1];
          auVar35 = vpaddw_avx2((undefined1  [32])alVar9,(undefined1  [32])alVar2);
          auVar26 = vpaddw_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar8);
          auVar33 = vpunpcklwd_avx2(auVar35,auVar26);
          auVar37 = vpunpcklwd_avx2((undefined1  [32])alVar28,(undefined1  [32])alVar10);
          auVar27 = vpunpckhwd_avx2(auVar35,auVar26);
          auVar30 = vpunpckhwd_avx2((undefined1  [32])alVar28,(undefined1  [32])alVar10);
          auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar33);
          auVar26 = vpmaddwd_avx2(auVar43,auVar37);
          local_460 = (__m256i)vpaddd_avx2(auVar26,auVar35);
          auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar27);
          auVar26 = vpmaddwd_avx2(auVar43,auVar30);
          local_440 = vpaddd_avx2(auVar26,auVar35);
          auVar35 = vpaddw_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar28);
          alVar3 = *palVar16;
          auVar26 = vpaddw_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar3);
          auVar33 = vpunpcklwd_avx2(auVar26,auVar35);
          auVar37 = vpunpcklwd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar11);
          auVar27 = vpunpckhwd_avx2(auVar26,auVar35);
          auVar30 = vpunpckhwd_avx2((undefined1  [32])alVar10,(undefined1  [32])alVar11);
          auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar33);
          auVar26 = vpmaddwd_avx2(auVar43,auVar37);
          local_420 = vpaddd_avx2(auVar26,auVar35);
          auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar27);
          auVar26 = vpmaddwd_avx2(auVar43,auVar30);
          local_400 = vpaddd_avx2(auVar26,auVar35);
          xy_y_round_store_16x2_avx2(&local_460,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          palVar16 = palVar16 + 2;
          h = h + -2;
          alVar12 = alVar11;
          alVar8 = alVar10;
          alVar9 = alVar28;
          alVar10 = alVar2;
          alVar11 = alVar3;
        } while (h != 0);
      }
      else {
        local_460 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_5e0,(undefined1  [32])local_5c0
                                            );
        local_440 = vpunpcklwd_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_580);
        local_400 = vpunpckhwd_avx2((undefined1  [32])local_5e0,(undefined1  [32])local_5c0);
        local_3e0 = vpunpckhwd_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_580);
        local_2e0 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_5c0,(undefined1  [32])local_5a0
                                            );
        local_2c0 = vpunpcklwd_avx2((undefined1  [32])local_580,(undefined1  [32])local_560);
        local_280 = vpunpckhwd_avx2((undefined1  [32])local_5c0,(undefined1  [32])local_5a0);
        local_260 = vpunpckhwd_avx2((undefined1  [32])local_580,(undefined1  [32])local_560);
        do {
          xy_y_convolve_6tap_16x2_avx2
                    (im_block,0x10,&local_5e0,&local_460,&local_2e0,&local_640,(__m256i *)local_160)
          ;
          xy_y_round_store_16x2_avx2((__m256i *)local_160,dst,(long)dst_stride);
          im_block = im_block + 0x20;
          dst = dst + dst_stride * 2;
          h = h + -2;
        } while (h != 0);
      }
    }
    else if (w == 8) {
      auVar35 = *(undefined1 (*) [32])im_block;
      auVar26 = *(undefined1 (*) [32])(im_block + 8);
      auVar27 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar30 = *(undefined1 (*) [32])(im_block + 0x18);
      if (subpel_y_q4 == 8) {
        pauVar17 = (undefined1 (*) [32])(im_block + 0x28);
        do {
          auVar33 = *(undefined1 (*) [32])(pauVar17[-1] + 0x10);
          auVar37 = *pauVar17;
          auVar35 = vpaddw_avx2(auVar37,auVar35);
          auVar26 = vpaddw_avx2(auVar33,auVar26);
          auVar6 = vpunpcklwd_avx2(auVar35,auVar26);
          auVar7 = vpunpcklwd_avx2(auVar27,auVar30);
          auVar41 = vpunpckhwd_avx2(auVar35,auVar26);
          auVar5 = vpunpckhwd_avx2(auVar27,auVar30);
          auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar6);
          auVar26 = vpmaddwd_avx2(auVar43,auVar7);
          local_460 = (__m256i)vpaddd_avx2(auVar26,auVar35);
          auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar41);
          auVar26 = vpmaddwd_avx2(auVar43,auVar5);
          local_440 = vpaddd_avx2(auVar26,auVar35);
          xy_y_round_store_8x2_avx2(&local_460,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar17 = pauVar17 + 1;
          h = h + -2;
          auVar26 = auVar30;
          auVar35 = auVar27;
          auVar27 = auVar33;
          auVar30 = auVar37;
        } while (h != 0);
      }
      else {
        local_5e0 = (__m256i)vpunpcklwd_avx2(auVar35,auVar26);
        local_5c0 = (__m256i)vpunpcklwd_avx2(auVar27,auVar30);
        local_580 = (__m256i)vpunpckhwd_avx2(auVar35,auVar26);
        local_560 = (__m256i)vpunpckhwd_avx2(auVar27,auVar30);
        pauVar17 = (undefined1 (*) [32])(im_block + 0x28);
        auVar43 = (undefined1  [32])local_560;
        alVar42 = local_5c0;
        do {
          alVar8 = (__m256i)vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar17[-1] + 0x10),*pauVar17);
          auVar35 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar17[-1] + 0x10),*pauVar17);
          local_5a0 = alVar8;
          local_540 = auVar35;
          xy_y_convolve_6tap_16_avx2(&local_5e0,&local_640,&local_460);
          local_5e0 = alVar42;
          local_5c0 = alVar8;
          local_580 = (__m256i)auVar43;
          local_560 = (__m256i)auVar35;
          xy_y_round_store_8x2_avx2(&local_460,dst,(long)dst_stride);
          dst = dst + dst_stride * 2;
          pauVar17 = pauVar17 + 1;
          h = h + -2;
          auVar43 = auVar35;
          alVar42 = alVar8;
        } while (h != 0);
      }
    }
    else if (w == 4) {
      uVar1 = *(ulong *)(im_block + 0x10);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(im_block + 4);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)im_block;
      auVar35._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar22;
      auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(im_block + 8);
      auVar30._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar36;
      auVar30._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
      auVar35 = vpunpcklwd_avx2(auVar35,auVar30);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(im_block + 0xc);
      auVar33._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar32;
      auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar25;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar1;
      auVar26._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar25;
      auVar26._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar19;
      auVar26 = vpunpcklwd_avx2(auVar33,auVar26);
      lVar14 = 0;
      auVar27._8_4_ = 0x400;
      auVar27._0_8_ = 0x40000000400;
      auVar27._12_4_ = 0x400;
      auVar27._16_4_ = 0x400;
      auVar27._20_4_ = 0x400;
      auVar27._24_4_ = 0x400;
      auVar27._28_4_ = 0x400;
      do {
        auVar35 = vpmaddwd_avx2((undefined1  [32])alVar42,auVar35);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(im_block + lVar14 * 4 + 0x14);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = uVar1;
        auVar37._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar23;
        auVar37._16_16_ = ZEXT116(1) * auVar29;
        uVar1 = *(ulong *)(im_block + lVar14 * 4 + 0x18);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar1;
        auVar41._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar29;
        auVar41._16_16_ = ZEXT116(1) * auVar24;
        auVar30 = vpmaddwd_avx2(auVar43,auVar26);
        auVar33 = vpunpcklwd_avx2(auVar37,auVar41);
        auVar35 = vpaddd_avx2(auVar30,auVar35);
        auVar35 = vpaddd_avx2(auVar35,auVar27);
        auVar30 = vpmaddwd_avx2(auVar33,local_600);
        auVar35 = vpaddd_avx2(auVar35,auVar30);
        auVar35 = vpsrad_avx2(auVar35,0xb);
        auVar35 = vpackssdw_avx2(auVar35,auVar35);
        auVar35 = vpackuswb_avx2(auVar35,auVar35);
        *(int *)dst = auVar35._0_4_;
        *(int *)(dst + dst_stride) = auVar35._16_4_;
        dst = dst + dst_stride * 2;
        lVar14 = lVar14 + 2;
        auVar35 = auVar26;
        auVar26 = auVar33;
      } while (h != (int)lVar14);
    }
    else {
      lVar14 = (long)w;
      lVar13 = 0;
      piVar15 = im_block;
      do {
        dst_00 = dst + lVar13;
        local_5e0 = *(__m256i *)(im_block + lVar13);
        local_5c0 = *(__m256i *)(im_block + lVar13 + lVar14);
        local_5a0 = *(__m256i *)(im_block + lVar13 + lVar14 * 2);
        local_580 = *(__m256i *)(im_block + lVar13 + lVar14 * 3);
        local_560 = *(__m256i *)(im_block + lVar13 + lVar14 * 4);
        local_460 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_5e0,(undefined1  [32])local_5c0
                                            );
        local_440 = vpunpcklwd_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_580);
        local_400 = vpunpckhwd_avx2((undefined1  [32])local_5e0,(undefined1  [32])local_5c0);
        local_3e0 = vpunpckhwd_avx2((undefined1  [32])local_5a0,(undefined1  [32])local_580);
        local_2e0 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_5c0,(undefined1  [32])local_5a0
                                            );
        local_2c0 = vpunpcklwd_avx2((undefined1  [32])local_580,(undefined1  [32])local_560);
        local_280 = vpunpckhwd_avx2((undefined1  [32])local_5c0,(undefined1  [32])local_5a0);
        local_260 = vpunpckhwd_avx2((undefined1  [32])local_580,(undefined1  [32])local_560);
        local_520 = *(__m256i *)(im_block + lVar13 + 0x10);
        local_500 = *(undefined1 (*) [32])(im_block + lVar13 + lVar14 + 0x10);
        local_4e0 = *(undefined1 (*) [32])(im_block + lVar13 + lVar14 * 2 + 0x10);
        local_4c0 = *(undefined1 (*) [32])(im_block + lVar13 + lVar14 * 3 + 0x10);
        local_4a0 = *(undefined1 (*) [32])(im_block + lVar13 + lVar14 * 4 + 0x10);
        local_3a0 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_520,local_500);
        local_380 = vpunpcklwd_avx2(local_4e0,local_4c0);
        local_340 = vpunpckhwd_avx2((undefined1  [32])local_520,local_500);
        local_320 = vpunpckhwd_avx2(local_4e0,local_4c0);
        local_220 = (__m256i)vpunpcklwd_avx2(local_500,local_4e0);
        local_200 = vpunpcklwd_avx2(local_4c0,local_4a0);
        local_1c0 = vpunpckhwd_avx2(local_500,local_4e0);
        local_1a0 = vpunpckhwd_avx2(local_4c0,local_4a0);
        src = piVar15;
        iVar18 = h;
        do {
          xy_y_convolve_6tap_16x2_avx2
                    (src,lVar14,&local_5e0,&local_460,&local_2e0,&local_640,(__m256i *)local_160);
          xy_y_convolve_6tap_16x2_avx2
                    (src + 0x10,lVar14,&local_520,&local_3a0,&local_220,&local_640,
                     (__m256i *)local_e0);
          xy_y_round_store_32_avx2((__m256i *)local_160,(__m256i *)local_e0,dst_00);
          xy_y_round_store_32_avx2((__m256i *)local_120,(__m256i *)local_a0,dst_00 + dst_stride);
          dst_00 = dst_00 + dst_stride * 2;
          src = src + w * 2;
          iVar18 = iVar18 + -2;
        } while (iVar18 != 0);
        lVar13 = lVar13 + 0x20;
        piVar15 = piVar15 + 0x20;
      } while (lVar13 < lVar14);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_6tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[3], s_32[6], ss_128[3];

    prepare_coeffs_6tap_ssse3(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_6tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[3];

    prepare_coeffs_6tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[6];
      __m256i s_256[6], ss_256[3];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_6tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[6], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[6];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);

        ss_256[3] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
        ss_256[4] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);

        do {
          xy_y_convolve_6tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_6tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[6];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 16));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[6], tt_256[6], r[4];

        ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
        ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
        ss_256[3] = _mm256_unpackhi_epi16(s_256[0], s_256[1]);
        ss_256[4] = _mm256_unpackhi_epi16(s_256[2], s_256[3]);

        tt_256[0] = _mm256_unpacklo_epi16(s_256[1], s_256[2]);
        tt_256[1] = _mm256_unpacklo_epi16(s_256[3], s_256[4]);
        tt_256[3] = _mm256_unpackhi_epi16(s_256[1], s_256[2]);
        tt_256[4] = _mm256_unpackhi_epi16(s_256[3], s_256[4]);

        do {
          xy_y_convolve_6tap_16x2_avx2(im, 16, s_256, ss_256, tt_256,
                                       coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);
          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        __m256i ss_256[4], r[4];

        do {
          xy_y_convolve_6tap_16x2_half_pel_avx2(im, 16, s_256, ss_256,
                                                coeffs_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;

      assert(!(w % 32));

      __m256i s_256[2][6], ss_256[2][6], tt_256[2][6], r0[4], r1[4];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        loadu_unpack_16bit_5rows_avx2(s, w, s_256[0], ss_256[0], tt_256[0]);
        loadu_unpack_16bit_5rows_avx2(s + 16, w, s_256[1], ss_256[1],
                                      tt_256[1]);

        y = h;
        do {
          xy_y_convolve_6tap_16x2_avx2(s, w, s_256[0], ss_256[0], tt_256[0],
                                       coeffs_256, r0);
          xy_y_convolve_6tap_16x2_avx2(s + 16, w, s_256[1], ss_256[1],
                                       tt_256[1], coeffs_256, r1);

          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}